

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jit.c
# Opt level: O2

int ravi_dump_ir(lua_State *L)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = lua_gettop(L);
  if (iVar1 != 1) {
    luaL_argerror(L,1,"1 argument expected");
  }
  iVar1 = lua_type(L,1);
  if (iVar1 == 6) {
    iVar1 = lua_iscfunction(L,1);
    if (iVar1 == 0) goto LAB_0013305e;
  }
  luaL_argerror(L,1,"argument must be a Lua function");
LAB_0013305e:
  pvVar2 = lua_topointer(L,1);
  raviV_dumpIR(L,*(Proto **)((long)pvVar2 + 0x18));
  return 0;
}

Assistant:

static int ravi_dump_ir(lua_State *L) {
  int n = lua_gettop(L);
  luaL_argcheck(L, n == 1, 1, "1 argument expected");
  luaL_argcheck(L, lua_isfunction(L, 1) && !lua_iscfunction(L, 1), 1,
                "argument must be a Lua function");
  void *p = (void *)lua_topointer(L, 1);
  LClosure *l = (LClosure *)(p);
  raviV_dumpIR(L, l->p);
  return 0;
}